

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O3

bool __thiscall QJsonArray::detach(QJsonArray *this,qsizetype reserve)

{
  QCborContainerPrivate *pQVar1;
  bool bVar2;
  
  pQVar1 = (this->a).d.ptr;
  if (pQVar1 == (QCborContainerPrivate *)0x0) {
    bVar2 = true;
  }
  else {
    if (reserve == 0) {
      reserve = (pQVar1->elements).d.size;
    }
    pQVar1 = QCborContainerPrivate::detach(pQVar1,reserve);
    QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(&this->a,pQVar1);
    bVar2 = (this->a).d.ptr != (QCborContainerPrivate *)0x0;
  }
  return bVar2;
}

Assistant:

bool QJsonArray::detach(qsizetype reserve)
{
    if (!a)
        return true;
    a = a->detach(a.data(), reserve ? reserve : size());
    return a;
}